

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-caps.c
# Opt level: O0

int lws_plat_drop_app_privileges(lws_context *context,int actually_drop)

{
  int iVar1;
  group *pgVar2;
  passwd *ppVar3;
  int *piVar4;
  char *pcVar5;
  group *g;
  passwd *p;
  int actually_drop_local;
  lws_context *context_local;
  
  if (context->groupname != (char *)0x0) {
    pgVar2 = getgrnam(context->groupname);
    if (pgVar2 == (group *)0x0) {
      _lws_log(1,"%s: unknown groupname \'%s\'\n","lws_plat_drop_app_privileges",context->groupname)
      ;
      return 1;
    }
    _lws_log(8,"%s: group %s -> gid %u\n","lws_plat_drop_app_privileges",context->groupname,
             (ulong)pgVar2->gr_gid);
    context->gid = pgVar2->gr_gid;
  }
  if (context->username != (char *)0x0) {
    ppVar3 = getpwnam(context->username);
    if (ppVar3 == (passwd *)0x0) {
      _lws_log(1,"%s: unknown username %s\n","lws_plat_drop_app_privileges",context->username);
      return 1;
    }
    context->uid = ppVar3->pw_uid;
    _lws_log(8,"%s: username %s -> uid %u\n","lws_plat_drop_app_privileges",context->username,
             (ulong)ppVar3->pw_uid);
  }
  if (actually_drop == 0) {
    return 0;
  }
  if ((context->gid == 0) || (context->gid == -1)) {
    _lws_log(8,"%s: not changing group\n","lws_plat_drop_app_privileges");
  }
  else {
    pgVar2 = getgrgid(context->gid);
    if (pgVar2 == (group *)0x0) {
      _lws_log(1,"%s: cannot find name for gid %d\n","lws_plat_drop_app_privileges",
               (ulong)(uint)context->gid);
      return 1;
    }
    iVar1 = setgid(context->gid);
    if (iVar1 != 0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      _lws_log(1,"%s: setgid: %s failed\n","lws_plat_drop_app_privileges",pcVar5);
      return 1;
    }
    _lws_log(4,"%s: effective group \'%s\'\n","lws_plat_drop_app_privileges",pgVar2->gr_name);
  }
  if ((context->uid == 0) || (context->uid == -1)) {
    _lws_log(8,"%s: not changing user\n","lws_plat_drop_app_privileges");
  }
  else {
    ppVar3 = getpwuid(context->uid);
    if (ppVar3 == (passwd *)0x0) {
      _lws_log(1,"%s: getpwuid: unable to find uid %d\n","lws_plat_drop_app_privileges",
               (ulong)(uint)context->uid);
      return 1;
    }
    initgroups(ppVar3->pw_name,context->gid);
    iVar1 = setuid(context->uid);
    if (iVar1 != 0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      _lws_log(1,"%s: setuid: %s failed\n","lws_plat_drop_app_privileges",pcVar5);
      return 1;
    }
    _lws_log(4,"%s: effective user \'%s\'\n","lws_plat_drop_app_privileges",ppVar3->pw_name);
  }
  return 0;
}

Assistant:

int
lws_plat_drop_app_privileges(struct lws_context *context, int actually_drop)
{
	struct passwd *p;
	struct group *g;

	/* if he gave us the groupname, align gid to match it */

	if (context->groupname) {
		g = getgrnam(context->groupname);

		if (g) {
			lwsl_info("%s: group %s -> gid %u\n", __func__,
				  context->groupname, g->gr_gid);
			context->gid = g->gr_gid;
		} else {
			lwsl_err("%s: unknown groupname '%s'\n", __func__,
				 context->groupname);

			return 1;
		}
	}

	/* if he gave us the username, align uid to match it */

	if (context->username) {
		p = getpwnam(context->username);

		if (p) {
			context->uid = p->pw_uid;

			lwsl_info("%s: username %s -> uid %u\n", __func__,
				  context->username, (unsigned int)p->pw_uid);
		} else {
			lwsl_err("%s: unknown username %s\n", __func__,
				 context->username);

			return 1;
		}
	}

	if (!actually_drop)
		return 0;

	/* if he gave us the gid or we have it from the groupname, set it */

	if (context->gid && context->gid != -1) {
		g = getgrgid(context->gid);

		if (!g) {
			lwsl_err("%s: cannot find name for gid %d\n",
				  __func__, context->gid);

			return 1;
		}

		if (setgid(context->gid)) {
			lwsl_err("%s: setgid: %s failed\n", __func__,
				 strerror(LWS_ERRNO));

			return 1;
		}

		lwsl_notice("%s: effective group '%s'\n", __func__,
			    g->gr_name);
	} else
		lwsl_info("%s: not changing group\n", __func__);


	/* if he gave us the uid or we have it from the username, set it */

	if (context->uid && context->uid != -1) {
		p = getpwuid(context->uid);

		if (!p) {
			lwsl_err("%s: getpwuid: unable to find uid %d\n",
				 __func__, context->uid);
			return 1;
		}

#if defined(LWS_HAVE_SYS_CAPABILITY_H) && defined(LWS_HAVE_LIBCAP)
		_lws_plat_apply_caps(CAP_PERMITTED, context->caps,
				     context->count_caps);
#endif

		initgroups(p->pw_name, context->gid);
		if (setuid(context->uid)) {
			lwsl_err("%s: setuid: %s failed\n", __func__,
				  strerror(LWS_ERRNO));

			return 1;
		} else
			lwsl_notice("%s: effective user '%s'\n",
				    __func__, p->pw_name);

#if defined(LWS_HAVE_SYS_CAPABILITY_H) && defined(LWS_HAVE_LIBCAP)
		_lws_plat_apply_caps(CAP_EFFECTIVE, context->caps,
				     context->count_caps);

		if (context->count_caps) {
			int n;
			for (n = 0; n < context->count_caps; n++)
				lwsl_notice("   RETAINING CAP %d\n",
					    (int)context->caps[n]);
		}
#endif
	} else
		lwsl_info("%s: not changing user\n", __func__);

	return 0;
}